

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qexception.cpp
# Opt level: O2

void __thiscall
QUnhandledException::QUnhandledException(QUnhandledException *this,QUnhandledException *other)

{
  long in_FS_OFFSET;
  QSharedDataPointer<QUnhandledExceptionPrivate> local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this->super_QException = (QException)&PTR__QUnhandledException_00668f68;
  local_18.d.ptr =
       (totally_ordered_wrapper<QUnhandledExceptionPrivate_*>)(QUnhandledExceptionPrivate *)0x0;
  std::
  __exchange<QSharedDataPointer<QUnhandledExceptionPrivate>,QSharedDataPointer<QUnhandledExceptionPrivate>>
            (&this->d,&other->d);
  QSharedDataPointer<QUnhandledExceptionPrivate>::~QSharedDataPointer(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUnhandledException::QUnhandledException(QUnhandledException &&other) noexcept
    : d(std::exchange(other.d, {}))
{
}